

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

int __thiscall Fl_Tabs::tab_positions(Fl_Tabs *this)

{
  size_t __size;
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Fl_Widget **ppFVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int wt;
  int ht;
  int local_40 [2];
  long local_38;
  
  uVar1 = (this->super_Fl_Group).children_;
  uVar16 = (ulong)uVar1;
  lVar14 = (long)(int)uVar1;
  if (uVar1 != this->tab_count) {
    clear_tab_positions(this);
    if (uVar1 != 0) {
      __size = lVar14 * 4 + 4;
      piVar5 = (int *)malloc(__size);
      this->tab_pos = piVar5;
      piVar5 = (int *)malloc(__size);
      this->tab_width = piVar5;
    }
    this->tab_count = uVar1;
  }
  if (uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    ppFVar6 = Fl_Group::array(&this->super_Fl_Group);
    cVar2 = fl_draw_shortcut;
    fl_draw_shortcut = '\x01';
    iVar4 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
    piVar5 = this->tab_pos;
    *piVar5 = iVar4;
    local_38 = lVar14;
    if ((int)uVar1 < 1) {
      iVar4 = 0;
      uVar7 = 0;
    }
    else {
      uVar15 = 0;
      uVar10 = 0;
      do {
        if ((ppFVar6[uVar15]->flags_ & 2) == 0) {
          uVar10 = uVar15 & 0xffffffff;
        }
        iVar4 = (int)uVar10;
        local_40[0] = 0;
        local_40[1] = 0;
        Fl_Label::measure(&ppFVar6[uVar15]->label_,local_40,local_40 + 1);
        this->tab_width[uVar15] = local_40[0] + 10;
        piVar5 = this->tab_pos;
        piVar5[uVar15 + 1] = local_40[0] + piVar5[uVar15] + 0xc;
        uVar15 = uVar15 + 1;
        uVar7 = uVar16;
      } while (uVar16 != uVar15);
    }
    iVar9 = (this->super_Fl_Group).super_Fl_Widget.w_;
    fl_draw_shortcut = cVar2;
    if (iVar9 < piVar5[uVar7]) {
      piVar5[uVar7] = iVar9;
      piVar8 = this->tab_width;
      iVar11 = piVar5[local_38];
      lVar14 = local_38;
      do {
        lVar14 = lVar14 + -1;
        iVar3 = iVar9 - piVar8[lVar14];
        if (iVar11 < iVar9 - piVar8[lVar14]) {
          iVar3 = iVar11;
        }
        iVar11 = iVar3;
        if (piVar5[lVar14] <= iVar11) break;
        piVar5[lVar14] = iVar11;
        iVar9 = iVar9 + -10;
      } while (lVar14 != 0);
      if (0 < (int)uVar1) {
        piVar8 = this->tab_width;
        lVar14 = 0;
        piVar12 = piVar5;
        piVar13 = piVar8;
        do {
          if (lVar14 <= *piVar12) break;
          *piVar12 = (int)lVar14;
          iVar9 = (this->super_Fl_Group).super_Fl_Widget.w_ + ~(uVar1 * 10);
          if (iVar9 < *piVar13) {
            *piVar13 = iVar9;
          }
          lVar14 = lVar14 + 10;
          piVar13 = piVar13 + 1;
          piVar12 = piVar12 + 1;
        } while (uVar16 * 10 != lVar14);
      }
      if (iVar4 < (int)uVar1) {
        do {
          piVar5[local_38] = piVar8[local_38 + -1] + piVar5[local_38 + -1];
          local_38 = local_38 + -1;
        } while (iVar4 < local_38);
      }
    }
  }
  return iVar4;
}

Assistant:

int Fl_Tabs::tab_positions() {
  const int nc = children();
  if (nc != tab_count) {
    clear_tab_positions();
    if (nc) {
      tab_pos   = (int*)malloc((nc+1)*sizeof(int));
      tab_width = (int*)malloc((nc+1)*sizeof(int));
    }
    tab_count = nc;
  }
  if (nc == 0) return 0;
  int selected = 0;
  Fl_Widget*const* a = array();
  int i;
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  tab_pos[0] = Fl::box_dx(box());
  for (i=0; i<nc; i++) {
    Fl_Widget* o = *a++;
    if (o->visible()) selected = i;

    int wt = 0; int ht = 0;
    o->measure_label(wt,ht);

    tab_width[i] = wt + EXTRASPACE;
    tab_pos[i+1] = tab_pos[i] + tab_width[i] + BORDER;
  }
  fl_draw_shortcut = prev_draw_shortcut;

  int r = w();
  if (tab_pos[i] <= r) return selected;
  // uh oh, they are too big:
  // pack them against right edge:
  tab_pos[i] = r;
  for (i = nc; i--;) {
    int l = r-tab_width[i];
    if (tab_pos[i+1] < l) l = tab_pos[i+1];
    if (tab_pos[i] <= l) break;
    tab_pos[i] = l;
    r -= EXTRASPACE;
  }
  // pack them against left edge and truncate width if they still don't fit:
  for (i = 0; i<nc; i++) {
    if (tab_pos[i] >= i*EXTRASPACE) break;
    tab_pos[i] = i*EXTRASPACE;
    int W = w()-1-EXTRASPACE*(nc-i) - tab_pos[i];
    if (tab_width[i] > W) tab_width[i] = W;
  }
  // adjust edges according to visiblity:
  for (i = nc; i > selected; i--) {
    tab_pos[i] = tab_pos[i-1] + tab_width[i-1];
  }
  return selected;
}